

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase759::run(TestCase759 *this)

{
  TaskSet **this_00;
  PromiseFulfiller<void> *pPVar1;
  int local_124;
  bool local_11f;
  bool local_11e;
  bool local_11d;
  bool local_11c;
  bool local_11b;
  undefined1 local_11a;
  Type local_119;
  undefined1 local_118;
  bool _kj_shouldLog_12;
  bool _kj_shouldLog_11;
  bool _kj_shouldLog_10;
  bool _kj_shouldLog_9;
  bool _kj_shouldLog_8;
  undefined1 local_108 [8];
  Promise<void> promise2;
  undefined1 local_f0 [5];
  bool _kj_shouldLog_7;
  undefined1 local_e0 [8];
  Promise<void> promise_1;
  PromiseFulfillerPair<void> paf;
  int local_a8;
  bool local_a4;
  bool local_a3;
  bool _kj_shouldLog_6;
  bool _kj_shouldLog_5;
  undefined1 local_a0 [4];
  bool _kj_shouldLog_4;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  undefined1 local_90 [8];
  Promise<void> promise;
  bool local_76;
  bool local_75;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  undefined1 local_68 [8];
  WaitScope waitScope;
  EventLoop loop;
  DummyEventPort port;
  TestCase759 *this_local;
  
  this_00 = &loop.daemons.ptr;
  port._8_8_ = this;
  DummyEventPort::DummyEventPort((DummyEventPort *)this_00);
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval,(EventPort *)this_00);
  WaitScope::WaitScope((WaitScope *)local_68,(EventLoop *)&waitScope.busyPollInterval);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) != 0) {
    local_75 = _::Debug::shouldLog(ERROR);
    while (local_75 != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2fc,ERROR,"\"failed: expected \" \"!(port.runnable)\"",
                 (char (*) [34])"failed: expected !(port.runnable)");
      local_75 = false;
    }
  }
  if (port.super_EventPort._vptr_EventPort._4_4_ != 0) {
    local_76 = _::Debug::shouldLog(ERROR);
    while (local_76 != false) {
      promise.super_PromiseBase.node.ptr._4_4_ = 0;
      _::Debug::log<char_const(&)[41],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2fd,ERROR,"\"failed: expected \" \"(0) == (port.callCount)\", 0, port.callCount"
                 ,(char (*) [41])"failed: expected (0) == (port.callCount)",
                 (int *)((long)&promise.super_PromiseBase.node.ptr + 4),
                 (int *)((long)&port.super_EventPort._vptr_EventPort + 4));
      local_76 = false;
    }
  }
  evalLater<kj::(anonymous_namespace)::TestCase759::run()::__0>
            ((kj *)local_a0,(Type *)&_kj_shouldLog_5);
  Promise<void>::eagerlyEvaluate((Promise<void> *)local_90,local_a0);
  Promise<void>::~Promise((Promise<void> *)local_a0);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) == 0) {
    _kj_shouldLog_6 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_6 != false) {
      _::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x302,ERROR,"\"failed: expected \" \"port.runnable\"",
                 (char (*) [31])"failed: expected port.runnable");
      _kj_shouldLog_6 = false;
    }
  }
  EventLoop::run((EventLoop *)&waitScope.busyPollInterval,1);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) != 0) {
    local_a3 = _::Debug::shouldLog(ERROR);
    while (local_a3 != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x304,ERROR,"\"failed: expected \" \"!(port.runnable)\"",
                 (char (*) [34])"failed: expected !(port.runnable)");
      local_a3 = false;
    }
  }
  if (port.super_EventPort._vptr_EventPort._4_4_ != 2) {
    local_a4 = _::Debug::shouldLog(ERROR);
    while (local_a4 != false) {
      local_a8 = 2;
      _::Debug::log<char_const(&)[41],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x305,ERROR,"\"failed: expected \" \"(2) == (port.callCount)\", 2, port.callCount"
                 ,(char (*) [41])"failed: expected (2) == (port.callCount)",&local_a8,
                 (int *)((long)&port.super_EventPort._vptr_EventPort + 4));
      local_a4 = false;
    }
  }
  Promise<void>::wait((Promise<void> *)local_90,local_68);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) != 0) {
    paf.fulfiller.ptr._7_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)paf.fulfiller.ptr._7_1_ != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x308,ERROR,"\"failed: expected \" \"!(port.runnable)\"",
                 (char (*) [34])"failed: expected !(port.runnable)");
      paf.fulfiller.ptr._7_1_ = false;
    }
  }
  if (port.super_EventPort._vptr_EventPort._4_4_ != 4) {
    paf.fulfiller.ptr._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)paf.fulfiller.ptr._6_1_ != false) {
      paf.fulfiller.ptr._0_4_ = 4;
      _::Debug::log<char_const(&)[41],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x309,ERROR,"\"failed: expected \" \"(4) == (port.callCount)\", 4, port.callCount"
                 ,(char (*) [41])"failed: expected (4) == (port.callCount)",
                 (int *)&paf.fulfiller.ptr,(int *)((long)&port.super_EventPort._vptr_EventPort + 4))
      ;
      paf.fulfiller.ptr._6_1_ = false;
    }
  }
  Promise<void>::~Promise((Promise<void> *)local_90);
  newPromiseAndFulfiller<void>();
  Promise<void>::then<kj::(anonymous_namespace)::TestCase759::run()::__1,kj::_::PropagateException>
            ((Promise<void> *)local_f0,(Type *)&promise_1.super_PromiseBase.node.ptr,
             (PropagateException *)((long)&promise2.super_PromiseBase.node.ptr + 7));
  Promise<void>::eagerlyEvaluate((Promise<void> *)local_e0,local_f0);
  Promise<void>::~Promise((Promise<void> *)local_f0);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) != 0) {
    promise2.super_PromiseBase.node.ptr._5_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)promise2.super_PromiseBase.node.ptr._5_1_ != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x30f,ERROR,"\"failed: expected \" \"!(port.runnable)\"",
                 (char (*) [34])"failed: expected !(port.runnable)");
      promise2.super_PromiseBase.node.ptr._5_1_ = false;
    }
  }
  evalLater<kj::(anonymous_namespace)::TestCase759::run()::__2>((kj *)&local_118,&local_119);
  Promise<void>::eagerlyEvaluate((Promise<void> *)local_108,&local_118);
  Promise<void>::~Promise((Promise<void> *)&local_118);
  pPVar1 = Own<kj::PromiseFulfiller<void>_>::operator->
                     ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
  (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_11a);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) == 0) {
    local_11b = _::Debug::shouldLog(ERROR);
    while (local_11b != false) {
      _::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x314,ERROR,"\"failed: expected \" \"port.runnable\"",
                 (char (*) [31])"failed: expected port.runnable");
      local_11b = false;
    }
  }
  EventLoop::run((EventLoop *)&waitScope.busyPollInterval,1);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) == 0) {
    local_11c = _::Debug::shouldLog(ERROR);
    while (local_11c != false) {
      _::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x316,ERROR,"\"failed: expected \" \"port.runnable\"",
                 (char (*) [31])"failed: expected port.runnable");
      local_11c = false;
    }
  }
  EventLoop::run((EventLoop *)&waitScope.busyPollInterval,10);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) != 0) {
    local_11d = _::Debug::shouldLog(ERROR);
    while (local_11d != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x318,ERROR,"\"failed: expected \" \"!(port.runnable)\"",
                 (char (*) [34])"failed: expected !(port.runnable)");
      local_11d = false;
    }
  }
  Promise<void>::wait((Promise<void> *)local_e0,local_68);
  if (((byte)port.super_EventPort._vptr_EventPort & 1) != 0) {
    local_11e = _::Debug::shouldLog(ERROR);
    while (local_11e != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x31b,ERROR,"\"failed: expected \" \"!(port.runnable)\"",
                 (char (*) [34])"failed: expected !(port.runnable)");
      local_11e = false;
    }
  }
  if (port.super_EventPort._vptr_EventPort._4_4_ != 8) {
    local_11f = _::Debug::shouldLog(ERROR);
    while (local_11f != false) {
      local_124 = 8;
      _::Debug::log<char_const(&)[41],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x31d,ERROR,"\"failed: expected \" \"(8) == (port.callCount)\", 8, port.callCount"
                 ,(char (*) [41])"failed: expected (8) == (port.callCount)",&local_124,
                 (int *)((long)&port.super_EventPort._vptr_EventPort + 4));
      local_11f = false;
    }
  }
  Promise<void>::~Promise((Promise<void> *)local_108);
  Promise<void>::~Promise((Promise<void> *)local_e0);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<void> *)&promise_1.super_PromiseBase.node.ptr);
  WaitScope::~WaitScope((WaitScope *)local_68);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, SetRunnable) {
  DummyEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  EXPECT_FALSE(port.runnable);
  EXPECT_EQ(0, port.callCount);

  {
    auto promise = evalLater([]() {}).eagerlyEvaluate(nullptr);

    EXPECT_TRUE(port.runnable);
    loop.run(1);
    EXPECT_FALSE(port.runnable);
    EXPECT_EQ(2, port.callCount);

    promise.wait(waitScope);
    EXPECT_FALSE(port.runnable);
    EXPECT_EQ(4, port.callCount);
  }

  {
    auto paf = newPromiseAndFulfiller<void>();
    auto promise = paf.promise.then([]() {}).eagerlyEvaluate(nullptr);
    EXPECT_FALSE(port.runnable);

    auto promise2 = evalLater([]() {}).eagerlyEvaluate(nullptr);
    paf.fulfiller->fulfill();

    EXPECT_TRUE(port.runnable);
    loop.run(1);
    EXPECT_TRUE(port.runnable);
    loop.run(10);
    EXPECT_FALSE(port.runnable);

    promise.wait(waitScope);
    EXPECT_FALSE(port.runnable);

    EXPECT_EQ(8, port.callCount);
  }
}